

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNESROM.cpp
# Opt level: O0

void __thiscall SNESROM::SNESROM(SNESROM *this,string *ROMImagePath)

{
  uint8_t *puVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  Logger *pLVar5;
  uint32_t *puVar6;
  double __x;
  double __x_00;
  double __x_01;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  allocator local_151;
  string local_150 [32];
  SNESROMHeader local_130;
  SNESROMHeader local_128;
  uint8_t local_119;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator local_d1;
  string local_d0 [32];
  SNESROMHeader local_b0;
  ImageAddress local_a8;
  uint8_t local_a1;
  ImageAddress headerAddress;
  ROMAddress *SNESHeaderROMAddress;
  undefined1 local_90 [7];
  RomLayout layout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator local_49;
  string local_48 [48];
  string *local_18;
  string *ROMImagePath_local;
  SNESROM *this_local;
  
  local_18 = ROMImagePath;
  ROMImagePath_local = (string *)this;
  readBytesFromFile(&this->m_actualImageData,ROMImagePath);
  this->m_headerlessImageData = (uint8_t *)0x0;
  SNESROMHeader::SNESROMHeader(&this->m_SNESROMHeader);
  SMCHeader::SMCHeader(&this->m_SMCHeader);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_actualImageData)
  ;
  if ((sVar3 & 0x1ff) != 0) {
    __assert_fail("m_actualImageData.size() % 512 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SuperMotte[P]65816Disassembler/snesdisasm/SNESROM.cpp"
                  ,0x37,"SNESROM::SNESROM(const std::string &)");
  }
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_actualImageData)
  ;
  if (sVar3 == 0) {
    __assert_fail("m_actualImageData.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SuperMotte[P]65816Disassembler/snesdisasm/SNESROM.cpp"
                  ,0x38,"SNESROM::SNESROM(const std::string &)");
  }
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->m_actualImageData,0);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_actualImageData)
  ;
  this->m_headerlessImageData = pvVar4 + (sVar3 & 0x3ff);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_actualImageData)
  ;
  if ((sVar3 & 0x3ff) != 0) {
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_actualImageData,0);
    SMCHeader::load(&this->m_SMCHeader,pvVar4);
    pLVar5 = Logger::Instance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"ROM has a SMC-Header",&local_49);
    std::__cxx11::to_string((string *)local_90,0x3f);
    std::operator+(&local_70,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/SuperMotte[P]65816Disassembler/snesdisasm/SNESROM.cpp:"
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    Logger::log(pLVar5,__x);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_a1 = (uint8_t)SMCHeader::layout(&this->m_SMCHeader);
    _headerAddress = getROMAddressObject((RomLayout)local_a1);
    ROMAddress::setROMAddress(_headerAddress,0xffc0);
    (**_headerAddress->_vptr_ROMAddress)(&local_a8);
    if (_headerAddress != (ROMAddress *)0x0) {
      operator_delete(_headerAddress);
    }
    puVar1 = this->m_headerlessImageData;
    puVar6 = ImageAddress::operator_cast_to_unsigned_int_(&local_a8);
    bVar2 = SNESROMHeader::mayBeThere(puVar1 + *puVar6);
    if (bVar2) {
      puVar1 = this->m_headerlessImageData;
      puVar6 = ImageAddress::operator_cast_to_unsigned_int_(&local_a8);
      SNESROMHeader::SNESROMHeader(&local_b0,puVar1 + *puVar6);
      SNESROMHeader::operator=(&this->m_SNESROMHeader,&local_b0);
      SNESROMHeader::~SNESROMHeader(&local_b0);
    }
    else {
      pLVar5 = Logger::Instance();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"SMC-Header lies about ROM layout",&local_d1);
      std::__cxx11::to_string(&local_118,0x4f);
      std::operator+(&local_f8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/SuperMotte[P]65816Disassembler/snesdisasm/SNESROM.cpp:"
                     ,&local_118);
      Logger::log(pLVar5,__x_00);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
    local_119 = (uint8_t)checkRomLayout(this);
  }
  bVar2 = SNESROMHeader::operator_cast_to_bool(&this->m_SNESROMHeader);
  if (!bVar2) {
    bVar2 = SNESROMHeader::mayBeThere(this->m_headerlessImageData + 0x7fc0);
    if (bVar2) {
      SNESROMHeader::SNESROMHeader(&local_128,this->m_headerlessImageData + 0x7fc0);
      SNESROMHeader::operator=(&this->m_SNESROMHeader,&local_128);
      SNESROMHeader::~SNESROMHeader(&local_128);
    }
    else {
      bVar2 = SNESROMHeader::mayBeThere(this->m_headerlessImageData + 0xffc0);
      if (bVar2) {
        SNESROMHeader::SNESROMHeader(&local_130,this->m_headerlessImageData + 0xffc0);
        SNESROMHeader::operator=(&this->m_SNESROMHeader,&local_130);
        SNESROMHeader::~SNESROMHeader(&local_130);
      }
      else {
        pLVar5 = Logger::Instance();
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_150,"There is no SNES header",&local_151);
        std::__cxx11::to_string(&local_198,0x5f);
        std::operator+(&local_178,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/SuperMotte[P]65816Disassembler/snesdisasm/SNESROM.cpp:"
                       ,&local_198);
        Logger::log(pLVar5,__x_01);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string(local_150);
        std::allocator<char>::~allocator((allocator<char> *)&local_151);
      }
    }
  }
  return;
}

Assistant:

SNESROM::SNESROM(const std::string &ROMImagePath)
    : m_actualImageData(readBytesFromFile(ROMImagePath)),
      m_headerlessImageData(nullptr){

    assert( m_actualImageData.size() % 512 == 0);
    assert( m_actualImageData.size() > 0);

    m_headerlessImageData = &m_actualImageData[0] +  m_actualImageData.size() % 1024;

    //this implies a SMC header
    if( m_actualImageData.size() % 1024 != 0){
        m_SMCHeader.load(&m_actualImageData[0]);
        LOG_SRC(STATE, "ROM has a SMC-Header");

        //since we have a SMC header, we ask it for lo/hi-rom status
        //not that this might be faulty so we gonna ignore that anyway
        RomLayout layout = m_SMCHeader.layout();

        //now that we know what rom-type it is, we can use that to find the header
        ROMAddress* SNESHeaderROMAddress = getROMAddressObject(layout);
        SNESHeaderROMAddress->setROMAddress(0x00FFC0);
        ImageAddress headerAddress = SNESHeaderROMAddress->toImageAddress();
        delete SNESHeaderROMAddress;

        //it is there. nice
        if(SNESROMHeader::mayBeThere(m_headerlessImageData + headerAddress)){
           m_SNESROMHeader = SNESROMHeader(m_headerlessImageData + headerAddress);
        }else{
            LOG_SRC(WARNING, "SMC-Header lies about ROM layout");
        }


        //bad programming: we ignore everything above and use the new check function
        layout = checkRomLayout();
    }

    if(!m_SNESROMHeader){
        if(SNESROMHeader::mayBeThere(m_headerlessImageData + 0x7fc0)){
            //headerless lorom
            m_SNESROMHeader = SNESROMHeader(m_headerlessImageData + 0x7fc0);
        }else if(SNESROMHeader::mayBeThere(m_headerlessImageData + 0xffc0)){
            //headerless hirom
            m_SNESROMHeader = SNESROMHeader(m_headerlessImageData + 0xffc0);
        }else{
            LOG_SRC(ERROR, "There is no SNES header");
        }
    }
}